

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

sexp_conflict
sexp_make_custom_output_port
          (sexp_conflict ctx,sexp_conflict self,sexp_conflict write,sexp_conflict seek,
          sexp_conflict close)

{
  sexp_conflict psVar1;
  sexp_conflict in_stack_00000008;
  
  psVar1 = sexp_make_custom_port
                     (ctx,(sexp_conflict)"w",&DAT_0000003e,write,seek,close,in_stack_00000008);
  return psVar1;
}

Assistant:

sexp sexp_make_custom_output_port (sexp ctx, sexp self,
                                   sexp write, sexp seek, sexp close) {
  sexp res = sexp_make_custom_port(ctx, self, "w", SEXP_FALSE, write, seek, close);
#if SEXP_USE_STRING_STREAMS
  if (!sexp_exceptionp(res))
    sexp_pointer_tag(res) = SEXP_OPORT;
#endif
  return res;
}